

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::BlockSingleNestedStructCase::init
          (BlockSingleNestedStructCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_> *this_00;
  ShaderInterface *this_01;
  deUint32 dVar1;
  StructType *this_02;
  StructType *this_03;
  UniformBlock *pUVar2;
  VarType local_80;
  Uniform local_68;
  
  this_01 = &(this->super_UniformBlockCase).m_interface;
  this_02 = deqp::gls::ub::ShaderInterface::allocStruct(this_01,"S");
  deqp::gls::ub::VarType::VarType((VarType *)&local_68,TYPE_INT_VEC3,4);
  deqp::gls::ub::StructType::addMember(this_02,"a",(VarType *)&local_68,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_FLOAT_MAT3,2);
  deqp::gls::ub::VarType::VarType((VarType *)&local_68,&local_80,4);
  deqp::gls::ub::StructType::addMember(this_02,"b",(VarType *)&local_68,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType((VarType *)&local_68,TYPE_FLOAT_VEC4,4);
  deqp::gls::ub::StructType::addMember(this_02,"c",(VarType *)&local_68,0xc00);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
  this_03 = deqp::gls::ub::ShaderInterface::allocStruct(this_01,"T");
  deqp::gls::ub::VarType::VarType((VarType *)&local_68,TYPE_FLOAT_MAT3,2);
  deqp::gls::ub::StructType::addMember(this_03,"a",(VarType *)&local_68,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
  deqp::gls::ub::VarType::VarType((VarType *)&local_68,this_02);
  deqp::gls::ub::StructType::addMember(this_03,"b",(VarType *)&local_68,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_68);
  pUVar2 = deqp::gls::ub::ShaderInterface::allocBlock(this_01,"Block");
  deqp::gls::ub::VarType::VarType(&local_80,this_02);
  deqp::gls::ub::Uniform::Uniform(&local_68,"s",&local_80,0);
  this_00 = &pUVar2->m_uniforms;
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (this_00,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_FLOAT_VEC2,1);
  deqp::gls::ub::Uniform::Uniform(&local_68,"v",&local_80,0xc00);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (this_00,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,this_03);
  deqp::gls::ub::Uniform::Uniform(&local_68,"t",&local_80,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (this_00,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  deqp::gls::ub::VarType::VarType(&local_80,TYPE_UINT,4);
  deqp::gls::ub::Uniform::Uniform(&local_68,"u",&local_80,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (this_00,&local_68);
  deqp::gls::ub::Uniform::~Uniform(&local_68);
  deqp::gls::ub::VarType::~VarType(&local_80);
  dVar1 = this->m_layoutFlags;
  pUVar2->m_flags = dVar1;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&pUVar2->m_instanceName);
    dVar1 = this->m_numInstances;
    pUVar2->m_arraySize = dVar1;
  }
  return dVar1;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH));
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH), UNUSED_BOTH);

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM));
		typeT.addMember("b", VarType(&typeS));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC2, PRECISION_LOW), UNUSED_BOTH));
		block.addUniform(Uniform("t", VarType(&typeT), 0));
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_HIGH), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}